

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_index_build(char *fn,int min_shift)

{
  htsExactFormat hVar1;
  htsFile *fp_00;
  hts_idx_t *idx_00;
  int local_34;
  int ret;
  htsFile *fp;
  hts_idx_t *idx;
  int min_shift_local;
  char *fn_local;
  
  local_34 = 0;
  fp_00 = hts_open(fn,"r");
  if (fp_00 == (htsFile *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    hVar1 = (fp_00->format).format;
    if (hVar1 == bam) {
      idx_00 = bam_index((fp_00->fp).bgzf,min_shift);
      if (idx_00 == (hts_idx_t *)0x0) {
        local_34 = -1;
      }
      else {
        hts_idx_save(idx_00,fn,(uint)(min_shift < 1));
        hts_idx_destroy(idx_00);
      }
    }
    else if (hVar1 == cram) {
      local_34 = cram_index_build((fp_00->fp).cram,fn);
    }
    else {
      local_34 = -1;
    }
    hts_close(fp_00);
    fn_local._4_4_ = local_34;
  }
  return fn_local._4_4_;
}

Assistant:

int bam_index_build(const char *fn, int min_shift)
{
    hts_idx_t *idx;
    htsFile *fp;
    int ret = 0;

    if ((fp = hts_open(fn, "r")) == 0) return -1;
    switch (fp->format.format) {
    case cram:
        ret = cram_index_build(fp->fp.cram, fn);
        break;

    case bam:
        idx = bam_index(fp->fp.bgzf, min_shift);
        if (idx) {
            hts_idx_save(idx, fn, (min_shift > 0)? HTS_FMT_CSI : HTS_FMT_BAI);
            hts_idx_destroy(idx);
        }
        else ret = -1;
        break;

    default:
        ret = -1;
        break;
    }
    hts_close(fp);

    return ret;
}